

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

void * dja::mat3::memcpy(void *__dest,void *__src,size_t __n)

{
  vec3 *this;
  float_t *__dest_00;
  undefined1 local_38 [8];
  mat3 m;
  bool rowmajor_local;
  float_t *v_local;
  
  m.m[2].y._3_1_ = (byte)__n & 1;
  unique0x100000a8 = __src;
  mat3((mat3 *)local_38,1.0);
  this = operator[]((mat3 *)local_38,0);
  __dest_00 = vec3::operator[](this,0);
  ::memcpy(__dest_00,stack0xfffffffffffffff0,0x24);
  if ((m.m[2].y._3_1_ & 1) == 0) {
    transpose((mat3 *)__dest,(mat3 *)local_38);
  }
  else {
    ::memcpy(__dest,local_38,0x24);
  }
  return __dest;
}

Assistant:

mat3 mat3::memcpy(const float_t *v, bool rowmajor)
{
    mat3 m;
    std::memcpy(&m[0][0], v, sizeof(mat3));
    return rowmajor ? m : transpose(m);
}